

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_data_transfer.c
# Opt level: O0

void single_data_transfer(arm7tdmi_t *state,arminstr_t *arminstr)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t data;
  uint *in_RSI;
  undefined8 *in_RDI;
  uint32_t rddata;
  uint32_t source;
  uint32_t address;
  immediate_as_offset_flags_t flags;
  int actual_offset;
  _Bool immediate_offset_type;
  _Bool pre;
  _Bool up;
  _Bool b;
  _Bool w;
  _Bool l;
  uint rn;
  uint rd;
  uint offset;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  uint32_t in_stack_fffffffffffffe2c;
  uint32_t in_stack_fffffffffffffe30;
  shift_type_t in_stack_fffffffffffffe34;
  status_register_t *in_stack_fffffffffffffe38;
  status_register_t *in_stack_fffffffffffffe40;
  arm7tdmi_t *in_stack_fffffffffffffe48;
  int local_150;
  uint local_14c;
  uint local_148;
  uint local_140;
  byte local_136;
  int local_118;
  uint local_108;
  uint local_8c;
  int local_7c;
  uint local_4c;
  int local_40;
  
  local_140 = *in_RSI & 0xfff;
  uVar5 = *in_RSI >> 0xc & 0xf;
  uVar6 = *in_RSI >> 0x10 & 0xf;
  uVar7 = *in_RSI >> 0x14;
  local_136 = (byte)(*in_RSI >> 0x15) & 1;
  uVar8 = *in_RSI >> 0x16;
  uVar1 = *in_RSI;
  uVar2 = *in_RSI;
  bVar3 = (byte)(*in_RSI >> 0x19) & 1;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] l: %d w: %d b: %d u: %d p: %d i: %d\n",(ulong)((byte)uVar7 & 1),(ulong)local_136
           ,(ulong)((byte)uVar8 & 1),(ulong)((byte)(uVar1 >> 0x17) & 1),
           (ulong)((byte)(uVar2 >> 0x18) & 1),(uint)bVar3);
  }
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] rn: %d rd: %d, offset: 0x%03X\n",(ulong)uVar6,(ulong)uVar5,(ulong)local_140);
  }
  if ((uVar2 & 0x1000000) == 0) {
    local_136 = 1;
  }
  if ((local_136 != 0) && (uVar6 == 0xf)) {
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/single_data_transfer.c"
            ,0x2b);
    fprintf(_stderr,"Write-back must not be specified when Rn == R15\n\x1b[0;m");
    exit(1);
  }
  if (bVar3 != 0) {
    uVar4 = (ushort)local_140;
    if ((uVar4 & 0xf) == 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/single_data_transfer.c"
              ,0x33);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m","Can\'t use r15 here!");
      exit(1);
    }
    if ((uVar4 >> 4 & 1) != 0) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/single_data_transfer.c"
              ,0x35);
      fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
              "The documentation told me this was always going to be 0");
      exit(1);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Doing a shift type %d to the value of r%d by amount %d\n",
             (ulong)(uVar4 >> 5 & 3),(ulong)(uVar4 & 0xf),(ulong)(uVar4 >> 7));
    }
    if (uVar4 >> 7 == 0) {
      uVar9 = (uint)(uVar4 & 0xf);
      if (((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) != 0x11) || (uVar9 < 8)) || (0xc < uVar9)) &&
         (0xc < uVar9)) {
        if (uVar9 == 0xd) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            break;
          case 0x12:
            break;
          case 0x13:
            break;
          default:
            break;
          case 0x17:
            break;
          case 0x1b:
          }
        }
        else if (uVar9 == 0xe) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            break;
          case 0x12:
            break;
          case 0x13:
            break;
          default:
            break;
          case 0x17:
            break;
          case 0x1b:
          }
        }
        else if (uVar9 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar9);
          exit(1);
        }
      }
      local_140 = arm_shift_special_zero_behavior
                            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                             (shift_type_t)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffe38);
    }
    else {
      uVar9 = (uint)(uVar4 & 0xf);
      if (((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) != 0x11) || (uVar9 < 8)) || (0xc < uVar9)) &&
         (0xc < uVar9)) {
        if (uVar9 == 0xd) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            break;
          case 0x12:
            break;
          case 0x13:
            break;
          default:
            break;
          case 0x17:
            break;
          case 0x1b:
          }
        }
        else if (uVar9 == 0xe) {
          switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
          case 0x11:
            break;
          case 0x12:
            break;
          case 0x13:
            break;
          default:
            break;
          case 0x17:
            break;
          case 0x1b:
          }
        }
        else if (uVar9 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar9);
          exit(1);
        }
      }
      local_140 = arm_shift(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                            in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    }
  }
  if ((uVar1 >> 0x17 & 1) == 0) {
    local_140 = -local_140;
  }
  if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
    local_108 = *(uint *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c);
  }
  else if (uVar6 < 0xd) {
    local_108 = *(uint *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38);
  }
  else if (uVar6 == 0xd) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_8c = *(uint *)((long)in_RDI + 0x84);
      break;
    case 0x12:
      local_8c = *(uint *)(in_RDI + 0x12);
      break;
    case 0x13:
      local_8c = *(uint *)(in_RDI + 0x11);
      break;
    default:
      local_8c = *(uint *)(in_RDI + 0x10);
      break;
    case 0x17:
      local_8c = *(uint *)((long)in_RDI + 0x8c);
      break;
    case 0x1b:
      local_8c = *(uint *)((long)in_RDI + 0x94);
    }
    local_108 = local_8c;
  }
  else if (uVar6 == 0xe) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_4c = *(uint *)((long)in_RDI + 0x9c);
      break;
    case 0x12:
      local_4c = *(uint *)(in_RDI + 0x15);
      break;
    case 0x13:
      local_4c = *(uint *)(in_RDI + 0x14);
      break;
    default:
      local_4c = *(uint *)(in_RDI + 0x13);
      break;
    case 0x17:
      local_4c = *(uint *)((long)in_RDI + 0xa4);
      break;
    case 0x1b:
      local_4c = *(uint *)((long)in_RDI + 0xac);
    }
    local_108 = local_4c;
  }
  else {
    if (uVar6 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
      exit(1);
    }
    local_108 = *(uint *)(in_RDI + 0x16);
  }
  local_148 = local_108;
  if ((uVar2 & 0x1000000) != 0) {
    local_148 = local_140 + local_108;
  }
  if ((uVar7 & 1) == 0) {
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] I\'m gonna save r%d to 0x%08X\n",(ulong)uVar5,(ulong)local_148);
    }
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar5)) && (uVar5 < 0xd)) {
      local_118 = *(int *)((long)in_RDI + (ulong)(uVar5 - 8) * 4 + 0x6c);
    }
    else if (uVar5 < 0xd) {
      local_118 = *(int *)((long)in_RDI + (ulong)uVar5 * 4 + 0x38);
    }
    else if (uVar5 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_7c = *(int *)((long)in_RDI + 0x84);
        break;
      case 0x12:
        local_7c = *(int *)(in_RDI + 0x12);
        break;
      case 0x13:
        local_7c = *(int *)(in_RDI + 0x11);
        break;
      default:
        local_7c = *(int *)(in_RDI + 0x10);
        break;
      case 0x17:
        local_7c = *(int *)((long)in_RDI + 0x8c);
        break;
      case 0x1b:
        local_7c = *(int *)((long)in_RDI + 0x94);
      }
      local_118 = local_7c;
    }
    else if (uVar5 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_40 = *(int *)((long)in_RDI + 0x9c);
        break;
      case 0x12:
        local_40 = *(int *)(in_RDI + 0x15);
        break;
      case 0x13:
        local_40 = *(int *)(in_RDI + 0x14);
        break;
      default:
        local_40 = *(int *)(in_RDI + 0x13);
        break;
      case 0x17:
        local_40 = *(int *)((long)in_RDI + 0xa4);
        break;
      case 0x1b:
        local_40 = *(int *)((long)in_RDI + 0xac);
      }
      local_118 = local_40;
    }
    else {
      if (uVar5 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar5);
        exit(1);
      }
      local_118 = *(int *)(in_RDI + 0x16);
    }
    local_150 = local_118;
    if (uVar5 == 0xf) {
      local_150 = local_118 + 4;
    }
    if ((uVar8 & 1) == 0) {
      (*(code *)in_RDI[5])(local_148,local_150,2);
    }
    else {
      (*(code *)in_RDI[3])(local_148,(char)local_150,2,local_150);
    }
  }
  else {
    if ((uVar8 & 1) == 0) {
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] I\'m gonna load r%d with a word from 0x%08X\n",(ulong)uVar5,(ulong)local_148
              );
      }
      data = (*(code *)in_RDI[2])(local_148,2);
      local_14c = arm_ror((status_register_t *)0x0,data,(local_148 & 3) << 3);
    }
    else {
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] I\'m gonna load r%d with a byte from 0x%08X\n",(ulong)uVar5,(ulong)local_148
              );
      }
      bVar3 = (*(code *)*in_RDI)(local_148,2);
      local_14c = (uint)bVar3;
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] And that value is 0x%08X\n",(ulong)local_14c);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar5,(ulong)local_14c);
    }
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar5)) && (uVar5 < 0xd)) {
      *(uint *)((long)in_RDI + (ulong)(uVar5 - 8) * 4 + 0x6c) = local_14c;
    }
    else if (uVar5 < 0xd) {
      *(uint *)((long)in_RDI + (ulong)uVar5 * 4 + 0x38) = local_14c;
    }
    else if (uVar5 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x84) = local_14c;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x12) = local_14c;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x11) = local_14c;
        break;
      default:
        *(uint *)(in_RDI + 0x10) = local_14c;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0x8c) = local_14c;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0x94) = local_14c;
      }
    }
    else if (uVar5 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x9c) = local_14c;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x15) = local_14c;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x14) = local_14c;
        break;
      default:
        *(uint *)(in_RDI + 0x13) = local_14c;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0xa4) = local_14c;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0xac) = local_14c;
      }
    }
    else {
      if (uVar5 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar5);
        exit(1);
      }
      if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
      }
      else {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
      }
    }
    (*(code *)in_RDI[6])(1);
  }
  if ((local_136 != 0) && (((uVar7 & 1) == 0 || (uVar5 != uVar6)))) {
    if ((uVar2 & 0x1000000) == 0) {
      local_148 = local_140 + local_148;
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Writing back 0x%08X to r%d\n",(ulong)local_148,(ulong)uVar6);
    }
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar6,(ulong)local_148);
    }
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar6)) && (uVar6 < 0xd)) {
      *(uint *)((long)in_RDI + (ulong)(uVar6 - 8) * 4 + 0x6c) = local_148;
    }
    else if (uVar6 < 0xd) {
      *(uint *)((long)in_RDI + (ulong)uVar6 * 4 + 0x38) = local_148;
    }
    else if (uVar6 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x84) = local_148;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x12) = local_148;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x11) = local_148;
        break;
      default:
        *(uint *)(in_RDI + 0x10) = local_148;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0x8c) = local_148;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0x94) = local_148;
      }
    }
    else if (uVar6 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        *(uint *)((long)in_RDI + 0x9c) = local_148;
        break;
      case 0x12:
        *(uint *)(in_RDI + 0x15) = local_148;
        break;
      case 0x13:
        *(uint *)(in_RDI + 0x14) = local_148;
        break;
      default:
        *(uint *)(in_RDI + 0x13) = local_148;
        break;
      case 0x17:
        *(uint *)((long)in_RDI + 0xa4) = local_148;
        break;
      case 0x1b:
        *(uint *)((long)in_RDI + 0xac) = local_148;
      }
    }
    else {
      if (uVar6 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xeb);
        fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar6);
        exit(1);
      }
      if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
      }
      else {
        set_pc((arm7tdmi_t *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c);
      }
    }
  }
  return;
}

Assistant:

void single_data_transfer(arm7tdmi_t* state, arminstr_t* arminstr) {
    //  When 1, Register shifted by Immediate as Offset
    unsigned int offset = arminstr->parsed.SINGLE_DATA_TRANSFER.offset;
    // dest if this is LDR, source if this is STR
    unsigned int rd = arminstr->parsed.SINGLE_DATA_TRANSFER.rd;
    unsigned int rn = arminstr->parsed.SINGLE_DATA_TRANSFER.rn;
    // 0 == str, 1 == ldr
    bool l = arminstr->parsed.SINGLE_DATA_TRANSFER.l;
    // different meanings depending on state of P (writeback)
    bool w = arminstr->parsed.SINGLE_DATA_TRANSFER.w;
    // (byte) when 0, transfer word, when 1, transfer byte
    bool b = arminstr->parsed.SINGLE_DATA_TRANSFER.b;
    // When 0, subtract offset from base, when 1, add to base
    bool up = arminstr->parsed.SINGLE_DATA_TRANSFER.u;
    // when 0, offset after transfer, when 1, before transfer.
    bool pre = arminstr->parsed.SINGLE_DATA_TRANSFER.p;
    //  When 0, Immediate as Offset
    bool immediate_offset_type = arminstr->parsed.SINGLE_DATA_TRANSFER.i;

    logdebug("l: %d w: %d b: %d u: %d p: %d i: %d", l, w, b, up, pre, immediate_offset_type)
    logdebug("rn: %d rd: %d, offset: 0x%03X", rn, rd, offset)
    if (!pre) {
        w = true;
    }
    if (w && rn == 15) {
        logfatal("Write-back must not be specified when Rn == R15")
    }

    int actual_offset;

    if (immediate_offset_type) {
        immediate_as_offset_flags_t flags;
        flags.raw = offset;
        unimplemented(flags.rm == 15, "Can't use r15 here!")

        unimplemented(flags.reg_op != 0, "The documentation told me this was always going to be 0")

        logdebug("Doing a shift type %d to the value of r%d by amount %d", flags.shift_type, flags.rm, flags.shift_amount)
        if (flags.shift_amount == 0) {
            actual_offset = arm_shift_special_zero_behavior(state, NULL, flags.shift_type, get_register(state, flags.rm));
        } else {
            actual_offset = arm_shift(NULL, flags.shift_type, get_register(state, flags.rm), flags.shift_amount);
        }
    } else {
        actual_offset = (int) offset;
    }

    if (!up) {
        actual_offset = -actual_offset;
    }

    word address = get_register(state, rn);

    if (pre) {
        address += actual_offset;
    }


    if (l) { // LDR
        word source;
        if (b) { // Read a byte
            logdebug("I'm gonna load r%d with a byte from 0x%08X", rd, address)
            source = state->read_byte(address, ACCESS_NONSEQUENTIAL);
        }
        else { // Read a word
            logdebug("I'm gonna load r%d with a word from 0x%08X", rd, address)
            source = state->read_word(address, ACCESS_NONSEQUENTIAL);
            source = arm_ror(NULL, source, (address & 3u) << 3);
        }
        logdebug("And that value is 0x%08X", source)
        set_register(state, rd, source);
        state->cpu_idle(1);
    } else { // STR
        logdebug("I'm gonna save r%d to 0x%08X", rd, address)
        word rddata = get_register(state, rd);
        if (rd == 15) {
            rddata += 4;
        }
        if (b) {
            state->write_byte(address, rddata, ACCESS_NONSEQUENTIAL);
        } else {
            state->write_word(address, rddata, ACCESS_NONSEQUENTIAL);
        }
    }

    if (w && (!l || rd != rn)) {
        if (!pre) {
            address += actual_offset;
        }
        logdebug("Writing back 0x%08X to r%d", address, rn)
        set_register(state, rn, address);
    }
}